

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpGroupMemberDecorate
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t member_idx;
  Operand *pOVar3;
  bool bVar4;
  uint32_t i;
  uint32_t index;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac;
  OperandList new_operands;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  if (inst->opcode_ == OpGroupMemberDecorate) {
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = false;
    pOVar3 = Instruction::GetInOperand(inst,0);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spvtools::opt::Operand&>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &new_operands,pOVar3);
    for (index = 1; uVar2 = Instruction::NumInOperands(inst), index < uVar2; index = index + 2) {
      uVar2 = Instruction::GetSingleWordInOperand(inst,index);
      member_idx = Instruction::GetSingleWordInOperand(inst,index + 1);
      uVar2 = GetNewMemberIndex(this,uVar2,member_idx);
      bVar1 = true;
      if (uVar2 != 0xffffffff) {
        pOVar3 = Instruction::GetOperand(inst,index);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        emplace_back<spvtools::opt::Operand&>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &new_operands,pOVar3);
        if (uVar2 == member_idx) {
          pOVar3 = Instruction::GetOperand(inst,index + 1);
          std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
          emplace_back<spvtools::opt::Operand&>
                    ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                     &new_operands,pOVar3);
          bVar1 = bVar4;
        }
        else {
          init_list._M_len = 1;
          init_list._M_array = &local_ac;
          local_ac = uVar2;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
          local_88.type = SPV_OPERAND_TYPE_LITERAL_INTEGER;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
          emplace_back<spvtools::opt::Operand>
                    ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                     &new_operands,&local_88);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
          bVar1 = true;
        }
      }
      bVar4 = bVar1;
    }
    if (bVar4) {
      if ((long)new_operands.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)new_operands.
                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x30) {
        IRContext::KillInst((this->super_MemPass).super_Pass.context_,inst);
      }
      else {
        Instruction::SetInOperands(inst,&new_operands);
        IRContext::UpdateDefUse((this->super_MemPass).super_Pass.context_,inst);
      }
    }
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              (&new_operands);
    return bVar4;
  }
  __assert_fail("inst->opcode() == spv::Op::OpGroupMemberDecorate",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0x192,
                "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpGroupMemberDecorate(Instruction *)"
               );
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpGroupMemberDecorate(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpGroupMemberDecorate);

  bool modified = false;

  Instruction::OperandList new_operands;
  new_operands.emplace_back(inst->GetInOperand(0));
  for (uint32_t i = 1; i < inst->NumInOperands(); i += 2) {
    uint32_t type_id = inst->GetSingleWordInOperand(i);
    uint32_t member_idx = inst->GetSingleWordInOperand(i + 1);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);

    if (new_member_idx == kRemovedMember) {
      modified = true;
      continue;
    }

    new_operands.emplace_back(inst->GetOperand(i));
    if (new_member_idx != member_idx) {
      new_operands.emplace_back(
          Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));
      modified = true;
    } else {
      new_operands.emplace_back(inst->GetOperand(i + 1));
    }
  }

  if (!modified) {
    return false;
  }

  if (new_operands.size() == 1) {
    context()->KillInst(inst);
    return true;
  }

  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}